

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
::find_non_soo<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
           *this,key_arg<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
                 *key,size_t hash)

{
  ctrl_t *pcVar1;
  ulong uVar2;
  uint uVar3;
  ctrl_t cVar4;
  ctrl_t cVar5;
  ctrl_t cVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  bool bVar20;
  ushort uVar21;
  ctrl_t *pcVar22;
  slot_type *psVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  iterator iVar30;
  iterator iVar31;
  __m128i match;
  ulong local_88;
  ctrl_t *local_78;
  anon_union_8_1_a8a14541_for_iterator_2 local_68;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  
  uVar2 = *(ulong *)this;
  if (uVar2 == 1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe2a,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, K = std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>]"
                 );
  }
  if (uVar2 == 0) {
LAB_00311408:
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>]"
                 );
  }
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  local_88 = (hash >> 7 ^ *(ulong *)(this + 0x10) >> 0xc) & uVar2;
  pcVar22 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
            ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                       *)this);
  auVar27 = ZEXT216(CONCAT11((char)hash,(char)hash) & 0x7f7f);
  auVar27 = pshuflw(auVar27,auVar27,0);
  uVar24 = 0;
  do {
    pcVar1 = pcVar22 + local_88;
    cVar4 = *pcVar1;
    cVar5 = pcVar1[1];
    cVar6 = pcVar1[2];
    cVar7 = pcVar1[3];
    cVar8 = pcVar1[4];
    cVar9 = pcVar1[5];
    cVar10 = pcVar1[6];
    cVar11 = pcVar1[7];
    cVar12 = pcVar1[8];
    cVar13 = pcVar1[9];
    cVar14 = pcVar1[10];
    cVar15 = pcVar1[0xb];
    cVar16 = pcVar1[0xc];
    cVar17 = pcVar1[0xd];
    cVar18 = pcVar1[0xe];
    cVar19 = pcVar1[0xf];
    local_58 = auVar27[0];
    cStack_57 = auVar27[1];
    cStack_56 = auVar27[2];
    cStack_55 = auVar27[3];
    auVar28[0] = -(local_58 == cVar4);
    auVar28[1] = -(cStack_57 == cVar5);
    auVar28[2] = -(cStack_56 == cVar6);
    auVar28[3] = -(cStack_55 == cVar7);
    auVar28[4] = -(local_58 == cVar8);
    auVar28[5] = -(cStack_57 == cVar9);
    auVar28[6] = -(cStack_56 == cVar10);
    auVar28[7] = -(cStack_55 == cVar11);
    auVar28[8] = -(local_58 == cVar12);
    auVar28[9] = -(cStack_57 == cVar13);
    auVar28[10] = -(cStack_56 == cVar14);
    auVar28[0xb] = -(cStack_55 == cVar15);
    auVar28[0xc] = -(local_58 == cVar16);
    auVar28[0xd] = -(cStack_57 == cVar17);
    auVar28[0xe] = -(cStack_56 == cVar18);
    auVar28[0xf] = -(cStack_55 == cVar19);
    uVar21 = (ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe | (ushort)(auVar28[0xf] >> 7) << 0xf;
    uVar26 = (uint)uVar21;
    while( true ) {
      iVar30.field_1.slot_ = local_68.slot_;
      iVar30.ctrl_ = local_78;
      if (uVar21 == 0) break;
      uVar3 = 0;
      if (uVar26 != 0) {
        for (; (uVar26 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      psVar23 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                              *)this);
      uVar25 = uVar3 + local_88 & uVar2;
      if (key->second == psVar23[uVar25].second && psVar23[uVar25].first == key->first) {
        iVar30 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                 ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                                *)this,uVar25);
        break;
      }
      uVar21 = (ushort)(uVar26 - 1) & (ushort)uVar26;
      uVar26 = CONCAT22((short)(uVar26 - 1 >> 0x10),uVar21);
    }
    local_68 = iVar30.field_1;
    local_78 = iVar30.ctrl_;
    if (uVar21 != 0) {
LAB_003113ae:
      bVar20 = false;
      uVar25 = uVar24;
    }
    else {
      auVar29[0] = -(cVar4 == kEmpty);
      auVar29[1] = -(cVar5 == kEmpty);
      auVar29[2] = -(cVar6 == kEmpty);
      auVar29[3] = -(cVar7 == kEmpty);
      auVar29[4] = -(cVar8 == kEmpty);
      auVar29[5] = -(cVar9 == kEmpty);
      auVar29[6] = -(cVar10 == kEmpty);
      auVar29[7] = -(cVar11 == kEmpty);
      auVar29[8] = -(cVar12 == kEmpty);
      auVar29[9] = -(cVar13 == kEmpty);
      auVar29[10] = -(cVar14 == kEmpty);
      auVar29[0xb] = -(cVar15 == kEmpty);
      auVar29[0xc] = -(cVar16 == kEmpty);
      auVar29[0xd] = -(cVar17 == kEmpty);
      auVar29[0xe] = -(cVar18 == kEmpty);
      auVar29[0xf] = -(cVar19 == kEmpty);
      if ((((((((((((((((auVar29 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar29 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar29 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar29 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar29 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar29 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar29 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar29 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar29 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar29 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar29 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar29 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar19 == kEmpty) {
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                    *)this);
        local_78 = (ctrl_t *)0x0;
        goto LAB_003113ae;
      }
      if (*(ulong *)this == 0) goto LAB_00311408;
      uVar25 = uVar24 + 0x10;
      if (*(ulong *)this < uVar25) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe37,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, K = std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>]"
                     );
      }
      local_88 = local_88 + uVar24 + 0x10 & uVar2;
      bVar20 = true;
    }
    uVar24 = uVar25;
    if (!bVar20) {
      iVar31.field_1.slot_ = local_68.slot_;
      iVar31.ctrl_ = local_78;
      return iVar31;
    }
  } while( true );
}

Assistant:

iterator find_non_soo(const key_arg<K>& key, size_t hash) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return iterator_at(seq.offset(i));
      }
      if (ABSL_PREDICT_TRUE(g.MaskEmpty())) return end();
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }